

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

VariableP<float> __thiscall
deqp::gls::BuiltinPrecisionTests::ExpandContext::genSym<float>(ExpandContext *this,string *baseName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  SharedPtrStateBase *extraout_RDX;
  VariableP<float> VVar1;
  int local_64;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *baseName_local;
  ExpandContext *this_local;
  
  baseName_local = baseName;
  this_local = this;
  local_64 = Counter::operator()(*(Counter **)baseName);
  de::toString<int>(&local_60,&local_64);
  std::operator+(&local_40,in_RDX,&local_60);
  variable<float>((BuiltinPrecisionTests *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_state =
       extraout_RDX;
  VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr =
       (Variable<float> *)this;
  return (VariableP<float>)
         VVar1.super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>;
}

Assistant:

VariableP<T>		genSym			(const string& baseName)
	{
		return variable<T>(baseName + de::toString(m_symCounter()));
	}